

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolTCP.cpp
# Opt level: O0

void __thiscall
ProtocolTCP::ProcessRx(ProtocolTCP *this,DataBuffer *rxBuffer,uint8_t *sourceIP,uint8_t *targetIP)

{
  uint8_t *packet_00;
  byte bVar1;
  uint16_t uVar2;
  uint16_t localPort_00;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  int iVar6;
  TCPConnection *this_00;
  uint64_t uVar7;
  DataBuffer *buffer_00;
  int local_7c;
  int i;
  TCPConnection *tmp;
  uint32_t AcknowledgementNumber;
  uint32_t SequenceNumber;
  uint32_t time_us;
  uint16_t remoteWindowSize;
  uint16_t length;
  uint8_t *packet;
  uint8_t flags;
  DataBuffer *buffer;
  int count;
  uint16_t dataLength;
  uint8_t *data;
  uint8_t headerLength;
  uint16_t remotePort;
  uint16_t localPort;
  TCPConnection *pTStack_30;
  uint16_t checksum;
  TCPConnection *connection;
  uint8_t *targetIP_local;
  uint8_t *sourceIP_local;
  DataBuffer *rxBuffer_local;
  ProtocolTCP *this_local;
  
  packet._7_1_ = '\0';
  packet_00 = rxBuffer->Packet;
  uVar2 = ComputeChecksum(packet_00,rxBuffer->Length,sourceIP,targetIP);
  if (uVar2 == 0) {
    uVar2 = Unpack16(packet_00,0);
    localPort_00 = Unpack16(packet_00,2);
    uVar4 = Unpack32(packet_00,4);
    uVar5 = Unpack32(packet_00,8);
    bVar1 = Unpack8(packet_00,0xc);
    iVar6 = ((int)(uint)bVar1 >> 4) << 2;
    uVar3 = Unpack16(packet_00,0xe);
    rxBuffer->Packet = rxBuffer->Packet + iVar6;
    rxBuffer->Length = rxBuffer->Length - (ushort)(byte)iVar6;
    pTStack_30 = LocateConnection(this,uVar2,sourceIP,localPort_00);
    if (pTStack_30 == (TCPConnection *)0x0) {
      printf("Connection port %d not found\n",(ulong)localPort_00);
    }
    else {
      switch(pTStack_30->State) {
      case CLOSED:
        Reset(this,rxBuffer->MAC,localPort_00,uVar2,sourceIP);
        break;
      case LISTEN:
        if ((packet_00[0xd] & 2) != 0) {
          this_00 = NewClient(this,rxBuffer->MAC,sourceIP,uVar2,localPort_00);
          if (this_00 == (TCPConnection *)0x0) {
            printf("Failed to get connection for SYN\n");
          }
          else {
            TCPConnection::Allocate(this_00,rxBuffer->MAC);
            this_00->Parent = pTStack_30;
            this_00->State = SYN_RECEIVED;
            this_00->AcknowledgementNumber = uVar4;
            this_00->LastAck = this_00->AcknowledgementNumber;
            this_00->AcknowledgementNumber = this_00->AcknowledgementNumber + 1;
            TCPConnection::SendFlags(this_00,'\x12');
            this_00->SequenceNumber = this_00->SequenceNumber + 1;
            pTStack_30 = this_00;
          }
        }
        break;
      case SYN_SENT:
        if ((packet_00[0xd] & 2) != 0) {
          pTStack_30->AcknowledgementNumber = uVar4;
          pTStack_30->LastAck = pTStack_30->AcknowledgementNumber;
          if ((packet_00[0xd] & 0x10) == 0) {
            pTStack_30->State = SYN_RECEIVED;
            pTStack_30->AcknowledgementNumber = pTStack_30->AcknowledgementNumber + 1;
            TCPConnection::SendFlags(pTStack_30,'\x12');
          }
          else {
            pTStack_30->State = ESTABLISHED;
            TCPConnection::SendFlags(pTStack_30,'\x10');
          }
        }
        break;
      case SYN_RECEIVED:
        if (((packet_00[0xd] & 0x10) != 0) &&
           (pTStack_30->State = ESTABLISHED,
           pTStack_30->Parent->NewConnection == (TCPConnection *)0x0)) {
          pTStack_30->MaxSequenceTx = uVar5 + uVar3;
          pTStack_30->Parent->NewConnection = pTStack_30;
          osEvent::Notify(&pTStack_30->Parent->Event);
        }
        break;
      case ESTABLISHED:
        if ((packet_00[0xd] & 1) != 0) {
          pTStack_30->State = CLOSE_WAIT;
          pTStack_30->AcknowledgementNumber = pTStack_30->AcknowledgementNumber + 1;
          TCPConnection::SendFlags(pTStack_30,'\x10');
        }
        break;
      case FIN_WAIT_1:
        if ((packet_00[0xd] & 1) == 0) {
          if ((packet_00[0xd] & 0x10) != 0) {
            pTStack_30->State = FIN_WAIT_2;
          }
        }
        else {
          if ((packet_00[0xd] & 0x10) == 0) {
            pTStack_30->State = CLOSING;
          }
          else {
            pTStack_30->State = TIMED_WAIT;
          }
          pTStack_30->AcknowledgementNumber = pTStack_30->AcknowledgementNumber + 1;
          TCPConnection::SendFlags(pTStack_30,'\x10');
        }
        break;
      case FIN_WAIT_2:
        if ((packet_00[0xd] & 1) != 0) {
          pTStack_30->State = TIMED_WAIT;
          pTStack_30->AcknowledgementNumber = pTStack_30->AcknowledgementNumber + 1;
          uVar7 = osTime::GetTime();
          pTStack_30->Time_us = (uint32_t)uVar7;
          TCPConnection::SendFlags(pTStack_30,'\x10');
        }
        break;
      case CLOSE_WAIT:
        break;
      case CLOSING:
        break;
      case LAST_ACK:
        if ((packet_00[0xd] & 0x10) != 0) {
          pTStack_30->State = CLOSED;
        }
        break;
      case TIMED_WAIT:
        break;
      case TTCP_PERSIST:
      }
      if ((pTStack_30 != (TCPConnection *)0x0) &&
         ((((pTStack_30->State == ESTABLISHED || (pTStack_30->State == FIN_WAIT_1)) ||
           (pTStack_30->State == FIN_WAIT_2)) || (pTStack_30->State == CLOSE_WAIT)))) {
        uVar2 = rxBuffer->Length;
        pTStack_30->MaxSequenceTx = uVar5 + uVar3;
        osEvent::Notify(&pTStack_30->Event);
        if ((packet_00[0xd] & 0x10) != 0) {
          osMutex::Take(&pTStack_30->HoldingQueueLock,
                        "/workspace/llm4binary/github/license_c_cmakelists/rkimball[P]tinytcp/tcp_stack/ProtocolTCP.cpp"
                        ,0xe0);
          iVar6 = osQueue::GetCount(&pTStack_30->HoldingQueue);
          uVar7 = osTime::GetTime();
          for (local_7c = 0; local_7c < iVar6; local_7c = local_7c + 1) {
            buffer_00 = (DataBuffer *)osQueue::Get(&pTStack_30->HoldingQueue);
            if ((int)(uVar5 - buffer_00->AcknowledgementNumber) < 0) {
              osQueue::Put(&pTStack_30->HoldingQueue,buffer_00);
            }
            else {
              TCPConnection::CalculateRTT(pTStack_30,(int)uVar7 - buffer_00->Time_us);
              ProtocolIPv4::FreeTxBuffer(this->IP,buffer_00);
            }
          }
          osMutex::Give(&pTStack_30->HoldingQueueLock);
        }
        if ((packet_00[0xd] & 1) != 0) {
          if (pTStack_30->State == FIN_WAIT_1) {
            packet._7_1_ = '\x10';
            pTStack_30->State = CLOSE_WAIT;
          }
          else if (pTStack_30->State == ESTABLISHED) {
            pTStack_30->State = CLOSE_WAIT;
            packet._7_1_ = '\x10';
          }
        }
        if (uVar2 != 0) {
          rxBuffer->Disposable = false;
          TCPConnection::StoreRxData(pTStack_30,rxBuffer);
          ProtocolIPv4::FreeRxBuffer(this->IP,rxBuffer);
          osEvent::Notify(&pTStack_30->Event);
        }
        if (packet._7_1_ != '\0') {
          TCPConnection::SendFlags(pTStack_30,packet._7_1_);
        }
      }
    }
  }
  else {
    printf("TCP Checksum Failure\n");
  }
  return;
}

Assistant:

void ProtocolTCP::ProcessRx(DataBuffer* rxBuffer, const uint8_t* sourceIP, const uint8_t* targetIP)
{
    TCPConnection* connection;
    uint16_t checksum;
    uint16_t localPort;
    uint16_t remotePort;
    uint8_t headerLength;
    uint8_t* data;
    uint16_t dataLength;
    int count;
    DataBuffer* buffer;
    uint8_t flags = 0;
    uint8_t* packet = rxBuffer->Packet;
    uint16_t length = rxBuffer->Length;
    uint16_t remoteWindowSize;
    uint32_t time_us;

    uint32_t SequenceNumber;
    uint32_t AcknowledgementNumber;

    checksum = ComputeChecksum(packet, length, sourceIP, targetIP);

    if (checksum == 0)
    {
        // pass
        remotePort = Unpack16(packet, 0);
        localPort = Unpack16(packet, 2);
        SequenceNumber = Unpack32(packet, 4);
        AcknowledgementNumber = Unpack32(packet, 8);
        headerLength = (Unpack8(packet, 12) >> 4) * 4;
        remoteWindowSize = Unpack16(packet, 14);

        rxBuffer->Packet += headerLength;
        rxBuffer->Length -= headerLength;

        connection = LocateConnection(remotePort, sourceIP, localPort);
        if (connection == nullptr)
        {
            // No connection found
            printf("Connection port %d not found\n", localPort);
        }
        else
        {
            // Existing connection, process the state machine
            switch (connection->State)
            {
            case TCPConnection::CLOSED:
                // Do nothing
                Reset(rxBuffer->MAC, localPort, remotePort, sourceIP);
                break;
            case TCPConnection::LISTEN:
                if (SYN)
                {
                    // Need a closed connection to work with
                    TCPConnection* tmp = NewClient(rxBuffer->MAC, sourceIP, remotePort, localPort);
                    if (tmp != nullptr)
                    {
                        tmp->Allocate(rxBuffer->MAC);
                        tmp->Parent = connection;
                        connection = tmp;
                        connection->State = TCPConnection::SYN_RECEIVED;
                        connection->AcknowledgementNumber = SequenceNumber;
                        connection->LastAck = connection->AcknowledgementNumber;
                        connection->AcknowledgementNumber++; // SYN flag consumes a sequence number
                        connection->SendFlags(FLAG_SYN | FLAG_ACK);
                        connection->SequenceNumber++; // Our SYN costs too
                    }
                    else
                    {
                        printf("Failed to get connection for SYN\n");
                    }
                }
                break;
            case TCPConnection::SYN_SENT:
                if (SYN)
                {
                    connection->AcknowledgementNumber = SequenceNumber;
                    connection->LastAck = connection->AcknowledgementNumber;
                    if (ACK)
                    {
                        connection->State = TCPConnection::ESTABLISHED;
                        connection->SendFlags(FLAG_ACK);
                    }
                    else
                    {
                        // Simultaneous open
                        connection->State = TCPConnection::SYN_RECEIVED;
                        connection->AcknowledgementNumber++; // SYN flag consumes a sequence number
                        connection->SendFlags(FLAG_SYN | FLAG_ACK);
                    }
                }
                break;
            case TCPConnection::SYN_RECEIVED:
                if (ACK)
                {
                    connection->State = TCPConnection::ESTABLISHED;

                    if (connection->Parent->NewConnection == nullptr)
                    {
                        connection->MaxSequenceTx = AcknowledgementNumber + remoteWindowSize;
                        connection->Parent->NewConnection = connection;
                        connection->Parent->Event.Notify();
                    }
                }
                break;
            case TCPConnection::ESTABLISHED:
                if (FIN)
                {
                    connection->State = TCPConnection::CLOSE_WAIT;
                    connection->AcknowledgementNumber++; // FIN consumes sequence number
                    connection->SendFlags(FLAG_ACK);
                }
                break;
            case TCPConnection::FIN_WAIT_1:
                if (FIN)
                {
                    if (ACK)
                    {
                        connection->State = TCPConnection::TIMED_WAIT;
                        // Start TimedWait timer
                    }
                    else
                    {
                        connection->State = TCPConnection::CLOSING;
                    }
                    connection->AcknowledgementNumber++; // FIN consumes sequence number
                    connection->SendFlags(FLAG_ACK);
                }
                else if (ACK)
                {
                    connection->State = TCPConnection::FIN_WAIT_2;
                }
                break;
            case TCPConnection::FIN_WAIT_2:
                if (FIN)
                {
                    connection->State = TCPConnection::TIMED_WAIT;
                    // Start TimedWait timer
                    connection->AcknowledgementNumber++; // FIN consumes sequence number
                    connection->Time_us = (int32_t)osTime::GetTime();
                    connection->SendFlags(FLAG_ACK);
                }
                break;
            case TCPConnection::CLOSE_WAIT: break;
            case TCPConnection::CLOSING: break;
            case TCPConnection::LAST_ACK:
                if (ACK)
                {
                    connection->State = TCPConnection::CLOSED;
                }
                break;
            case TCPConnection::TIMED_WAIT: break;
            case TCPConnection::TTCP_PERSIST: break;
            }

            // Handle any data received
            if (connection && (connection->State == TCPConnection::ESTABLISHED ||
                               connection->State == TCPConnection::FIN_WAIT_1 ||
                               connection->State == TCPConnection::FIN_WAIT_2 ||
                               connection->State == TCPConnection::CLOSE_WAIT))
            {
                data = rxBuffer->Packet;
                dataLength = rxBuffer->Length;

                connection->MaxSequenceTx = AcknowledgementNumber + remoteWindowSize;
                connection->Event.Notify();

                // Handle any ACKed data
                if (ACK)
                {
                    connection->HoldingQueueLock.Take(__FILE__, __LINE__);
                    count = connection->HoldingQueue.GetCount();
                    time_us = (uint32_t)osTime::GetTime();
                    for (int i = 0; i < count; i++)
                    {
                        buffer = (DataBuffer*)connection->HoldingQueue.Get();
                        if ((int32_t)(AcknowledgementNumber - buffer->AcknowledgementNumber) >= 0)
                        {
                            connection->CalculateRTT((int32_t)(time_us - buffer->Time_us));
                            IP.FreeTxBuffer(buffer);
                        }
                        else
                        {
                            connection->HoldingQueue.Put(buffer);
                        }
                    }
                    connection->HoldingQueueLock.Give();
                }

                if (FIN)
                {
                    if (connection->State == TCPConnection::FIN_WAIT_1)
                    {
                        flags |= FLAG_ACK;
                        connection->State = TCPConnection::CLOSE_WAIT;
                    }
                    else if (connection->State == TCPConnection::ESTABLISHED)
                    {
                        connection->State = TCPConnection::CLOSE_WAIT;
                        flags |= FLAG_ACK;
                    }
                }

                // ACK the receipt of the data
                if (dataLength > 0)
                {
                    // Copy it to the application
                    rxBuffer->Disposable = false;
                    connection->StoreRxData(rxBuffer);
                    IP.FreeRxBuffer(rxBuffer);
                    connection->Event.Notify();
                }

                if (flags != 0)
                {
                    connection->SendFlags(flags);
                }
            }
        }
    }
    else
    {
        printf("TCP Checksum Failure\n");
    }
}